

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O0

TestSuite * __thiscall
iutest::UnitTestImpl::AddTestSuite<iutest::TypedTestSuite<unsigned_short>>
          (UnitTestImpl *this,string *testsuite_name,TestTypeId id,SetUpMethod setup,
          TearDownMethod teardown)

{
  TypedTestSuite<unsigned_short> *this_00;
  TypedTestSuite<unsigned_short> *local_38;
  TestSuite *p;
  TearDownMethod teardown_local;
  SetUpMethod setup_local;
  TestTypeId id_local;
  string *testsuite_name_local;
  UnitTestImpl *this_local;
  
  p = (TestSuite *)teardown;
  teardown_local = setup;
  setup_local = (SetUpMethod)id;
  id_local = testsuite_name;
  testsuite_name_local = (string *)this;
  local_38 = (TypedTestSuite<unsigned_short> *)FindTestSuite(this,testsuite_name,id);
  if (local_38 == (TypedTestSuite<unsigned_short> *)0x0) {
    this_00 = (TypedTestSuite<unsigned_short> *)operator_new(0xd0);
    TypedTestSuite<unsigned_short>::TypedTestSuite
              (this_00,(string *)id_local,setup_local,teardown_local,(TearDownMethod)p);
    local_38 = this_00;
    std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>::push_back
              (&this->m_testsuites,(value_type *)&local_38);
  }
  return &local_38->super_TestSuite;
}

Assistant:

TestSuite* AddTestSuite(const ::std::string& testsuite_name, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown IUTEST_APPEND_EXPLICIT_TEMPLATE_TYPE_(T) )
    {
        TestSuite* p = FindTestSuite(testsuite_name, id);
        if( p == NULL )
        {
            p = new T (testsuite_name, id, setup, teardown);
            m_testsuites.push_back(p);
        }
        return p;
    }